

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::DenselySampledSpectrum::Sample(DenselySampledSpectrum *this,SampledWavelengths *lambda)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  Float *pFVar4;
  const_reference pvVar5;
  int *in_RDI;
  undefined1 auVar6 [64];
  int offset;
  int i;
  SampledSpectrum s;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  value_type in_stack_ffffffffffffffc4;
  int local_24;
  array<float,_4> local_10;
  undefined1 extraout_var [60];
  
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x5468e2);
  local_24 = 0;
  do {
    if (3 < local_24) {
      return (array<float,_4>)(array<float,_4>)local_10.values;
    }
    auVar6._0_4_ = SampledWavelengths::operator[]
                             ((SampledWavelengths *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffbc);
    auVar6._4_60_ = extraout_var;
    lVar2 = std::lround(auVar6._0_8_);
    iVar1 = (int)lVar2 - *in_RDI;
    if (iVar1 < 0) {
LAB_00546943:
      pFVar4 = SampledSpectrum::operator[]
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
      *pFVar4 = 0.0;
    }
    else {
      sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                        ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 2));
      if (sVar3 <= (ulong)(long)iVar1) goto LAB_00546943;
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 2),
                          (long)iVar1);
      in_stack_ffffffffffffffc4 = *pvVar5;
      pFVar4 = SampledSpectrum::operator[]
                         ((SampledSpectrum *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffbc);
      *pFVar4 = in_stack_ffffffffffffffc4;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Sample(const SampledWavelengths &lambda) const {
        SampledSpectrum s;
        for (int i = 0; i < NSpectrumSamples; ++i) {
            int offset = std::lround(lambda[i]) - lambda_min;
            if (offset < 0 || offset >= values.size())
                s[i] = 0;
            else
                s[i] = values[offset];
        }
        return s;
    }